

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O3

void MULTICLASS::print_score(vw *all,example *ec,uint32_t prediction)

{
  bool holdout_set_off;
  shared_data *this;
  size_t current_pass;
  size_t sVar1;
  char temp_str [10];
  char label_str [512];
  char local_282 [10];
  string local_278;
  string local_258;
  char local_238 [520];
  
  snprintf(local_282,10,"%d",prediction);
  snprintf(local_238,0x200,"%u",(ulong)(ec->l).multi.label);
  this = all->sd;
  current_pass = all->current_pass;
  holdout_set_off = all->holdout_set_off;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  sVar1 = strlen(local_238);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,local_238,local_238 + sVar1);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  sVar1 = strlen(local_282);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,local_282,local_282 + sVar1);
  shared_data::print_update
            (this,holdout_set_off,current_pass,&local_278,&local_258,ec->num_features,
             all->progress_add,all->progress_arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  return;
}

Assistant:

void print_score(vw& all, example& ec, uint32_t prediction)
{
  char temp_str[10];
  sprintf_s(temp_str, 10, "%d", prediction);

  char label_str[512];
  sprintf_s(label_str, 512, "%u", ec.l.multi.label);

  all.sd->print_update(
      all.holdout_set_off, all.current_pass, label_str, temp_str, ec.num_features, all.progress_add, all.progress_arg);
}